

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2NodeTransformBlock(Parser *this,BaseNode *mesh)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  __type _Var6;
  uint i;
  long lVar7;
  Logger *pLVar8;
  aiMatrix4x4 *apOut;
  int iVar9;
  int local_94;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar9 = 0;
  local_94 = 0;
LAB_003d228b:
  do {
    while( true ) {
      if (*this->filePtr != '*') goto LAB_003d258d;
      this->filePtr = this->filePtr + 1;
      bVar5 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
      if (!bVar5) break;
      temp._M_dataplus._M_p = (pointer)&temp.field_2;
      temp._M_string_length = 0;
      temp.field_2._M_local_buf[0] = '\0';
      bVar5 = ParseString(this,&temp,"*NODE_NAME");
      if (!bVar5) {
        SkipToNextToken(this);
      }
      _Var6 = std::operator==(&temp,&mesh->mName);
      iVar4 = 1;
      if (!_Var6) {
        lVar7 = std::__cxx11::string::find((char *)&temp,0x632ce2);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&temp);
          _Var6 = std::operator==(&mesh->mName,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (_Var6) {
            if (mesh->mType == Camera) {
              iVar2 = *(int *)&mesh[1].mName._M_dataplus._M_p;
joined_r0x003d246a:
              iVar4 = 2;
              if (iVar2 == 1) goto LAB_003d2487;
            }
            else if (mesh->mType == Light) {
              iVar2 = *(int *)&mesh->field_0x154;
              goto joined_r0x003d246a;
            }
            pLVar8 = DefaultLogger::get();
            Logger::error(pLVar8,
                          "ASE: Ignoring target transform, this is no spot light or target camera");
            iVar4 = iVar9;
            goto LAB_003d2487;
          }
        }
        pLVar8 = DefaultLogger::get();
        std::operator+(&local_50,"ASE: Unknown node transformation: ",&temp);
        Logger::error(pLVar8,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        iVar4 = iVar9;
      }
LAB_003d2487:
      iVar9 = iVar4;
      std::__cxx11::string::~string((string *)&temp);
    }
    if (iVar9 != 0) {
      bVar5 = TokenMatch<char_const>(&this->filePtr,"TM_ROW3",7);
      if (bVar5) {
        ParseLV4MeshFloatTriple
                  (this,(ai_real *)((long)&mesh->inherit + (ulong)(iVar9 != 1) * 0x10 + -0x1c));
      }
      else {
        if (iVar9 != 1) goto LAB_003d258d;
        bVar5 = TokenMatch<char_const>(&this->filePtr,"TM_ROW0",7);
        apOut = &mesh->mTransform;
        if (((bVar5) ||
            (bVar5 = TokenMatch<char_const>(&this->filePtr,"TM_ROW1",7),
            apOut = (aiMatrix4x4 *)&(mesh->mTransform).b1, bVar5)) ||
           (bVar5 = TokenMatch<char_const>(&this->filePtr,"TM_ROW2",7),
           apOut = (aiMatrix4x4 *)&(mesh->mTransform).c1, bVar5)) {
          ParseLV4MeshFloatTriple(this,&apOut->a1);
        }
        else {
          bVar5 = TokenMatch<char_const>(&this->filePtr,"INHERIT_POS",0xb);
          if (bVar5) {
            ParseLV4MeshLongTriple(this,(uint *)&temp);
            for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
              (mesh->inherit).abInheritPosition[lVar7] =
                   *(int *)((long)&temp._M_dataplus._M_p + lVar7 * 4) != 0;
            }
          }
          else {
            bVar5 = TokenMatch<char_const>(&this->filePtr,"INHERIT_ROT",0xb);
            if (bVar5) {
              ParseLV4MeshLongTriple(this,(uint *)&temp);
              for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
                (mesh->inherit).abInheritRotation[lVar7] =
                     *(int *)((long)&temp._M_dataplus._M_p + lVar7 * 4) != 0;
              }
            }
            else {
              bVar5 = TokenMatch<char_const>(&this->filePtr,"INHERIT_SCL",0xb);
              if (!bVar5) goto LAB_003d258d;
              ParseLV4MeshLongTriple(this,(uint *)&temp);
              for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
                (mesh->inherit).abInheritScaling[lVar7] =
                     *(int *)((long)&temp._M_dataplus._M_p + lVar7 * 4) != 0;
              }
            }
          }
        }
        iVar9 = 1;
      }
      goto LAB_003d228b;
    }
LAB_003d258d:
    pbVar3 = (byte *)this->filePtr;
    bVar1 = *pbVar3;
    if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d25d5;
      this->iLineNumber = this->iLineNumber + 1;
      bVar5 = true;
    }
    else {
      if (bVar1 == 0x7b) {
        local_94 = local_94 + 1;
      }
      else if (bVar1 == 0x7d) {
        local_94 = local_94 + -1;
        if (local_94 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *NODE_TM chunk (Level 2)");
      }
LAB_003d25d5:
      bVar5 = false;
    }
    this->bLastWasEndLine = bVar5;
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV2NodeTransformBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();
    int mode   = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // name of the node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                std::string::size_type s;
                if (temp == mesh.mName)
                {
                    mode = 1;
                }
                else if (std::string::npos != (s = temp.find(".Target")) &&
                    mesh.mName == temp.substr(0,s))
                {
                    // This should be either a target light or a target camera
                    if ( (mesh.mType == BaseNode::Light &&  ((ASE::Light&)mesh) .mLightType  == ASE::Light::TARGET) ||
                         (mesh.mType == BaseNode::Camera && ((ASE::Camera&)mesh).mCameraType == ASE::Camera::TARGET))
                    {
                        mode = 2;
                    }
                    else {
                        ASSIMP_LOG_ERROR("ASE: Ignoring target transform, "
                            "this is no spot light or target camera");
                    }
                }
                else
                {
                    ASSIMP_LOG_ERROR("ASE: Unknown node transformation: " + temp);
                    // mode = 0
                }
                continue;
            }
            if (mode)
            {
                // fourth row of the transformation matrix - and also the
                // only information here that is interesting for targets
                if (TokenMatch(filePtr,"TM_ROW3" ,7))
                {
                    ParseLV4MeshFloatTriple((mode == 1 ? mesh.mTransform[3] : &mesh.mTargetPosition.x));
                    continue;
                }
                if (mode == 1)
                {
                    // first row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW0" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[0]);
                        continue;
                    }
                    // second row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW1" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[1]);
                        continue;
                    }
                    // third row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW2" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[2]);
                        continue;
                    }
                    // inherited position axes
                    if (TokenMatch(filePtr,"INHERIT_POS" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritPosition[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited rotation axes
                    if (TokenMatch(filePtr,"INHERIT_ROT" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritRotation[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited scaling axes
                    if (TokenMatch(filePtr,"INHERIT_SCL" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritScaling[i] = aiVal[i] != 0;
                        continue;
                    }
                }
            }
        }
        AI_ASE_HANDLE_SECTION("2","*NODE_TM");
    }
    return;
}